

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_generic_section.hpp
# Opt level: O3

void __thiscall
pstore::exchange::import_ns::
generic_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
::~generic_section(generic_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
                   *this)

{
  ~generic_section(this);
  operator_delete(this,0x60);
  return;
}

Assistant:

~generic_section () noexcept override = default;